

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNlaProductForm.cpp
# Opt level: O0

void __thiscall ProductFormUpdate::btran(ProductFormUpdate *this,HVector *rhs)

{
  double dVar1;
  int iVar2;
  int iVar3;
  const_reference pvVar4;
  reference pvVar5;
  const_reference pvVar6;
  reference pvVar7;
  long in_RSI;
  byte *in_RDI;
  HighsInt iEl;
  double pivot_value;
  HighsInt pivot_index;
  HighsInt iX;
  value_type local_58;
  int local_24;
  double local_20;
  int local_14;
  
  if ((*in_RDI & 1) != 0) {
    iVar3 = *(int *)(in_RDI + 8);
    while (local_14 = iVar3 + -1, -1 < local_14) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10),(long)local_14);
      iVar2 = *pvVar4;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x20),(long)iVar2);
      local_20 = *pvVar5;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_14);
      for (local_24 = *pvVar4;
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)iVar3),
          local_24 < *pvVar4; local_24 = local_24 + 1) {
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),
                            (long)local_24);
        dVar1 = *pvVar6;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x58),(long)local_24);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x20),(long)*pvVar4
                           );
        local_20 = -dVar1 * *pvVar5 + local_20;
      }
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x28),(long)local_14)
      ;
      local_58 = local_20 / *pvVar6;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x20),(long)iVar2);
      if ((*pvVar5 == 0.0) && (!NAN(*pvVar5))) {
        iVar3 = *(int *)(in_RSI + 4);
        *(int *)(in_RSI + 4) = iVar3 + 1;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RSI + 8),(long)iVar3);
        *pvVar7 = iVar2;
      }
      if (ABS(local_58) < 1e-14) {
        local_58 = 1e-100;
      }
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x20),(long)iVar2);
      *pvVar5 = local_58;
      iVar3 = local_14;
    }
  }
  return;
}

Assistant:

void ProductFormUpdate::btran(HVector& rhs) const {
  if (!valid_) return;
  assert(rhs.size == num_row_);
  assert((int)start_.size() == update_count_ + 1);
  for (HighsInt iX = update_count_ - 1; iX >= 0; iX--) {
    const HighsInt pivot_index = pivot_index_[iX];
    double pivot_value = rhs.array[pivot_index];
    for (HighsInt iEl = start_[iX]; iEl < start_[iX + 1]; iEl++)
      pivot_value -= value_[iEl] * rhs.array[index_[iEl]];
    pivot_value /= pivot_value_[iX];
    if (rhs.array[pivot_index] == 0) rhs.index[rhs.count++] = pivot_index;
    rhs.array[pivot_index] =
        (fabs(pivot_value) < kHighsTiny) ? 1e-100 : pivot_value;
  }
}